

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O0

void CMinit_local_formats(CManager cm)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  undefined4 uVar4;
  char *pcVar5;
  CManager cm_00;
  undefined8 uVar6;
  pthread_t pVar7;
  long in_RDI;
  timespec ts_1;
  timespec ts;
  FMContext fmc;
  timespec local_30;
  __time_t local_20;
  undefined4 local_18;
  CMTraceType in_stack_ffffffffffffffec;
  CManager in_stack_fffffffffffffff0;
  
  if (CMself_hosted_formats == -1) {
    CMself_hosted_formats = 1;
    pcVar5 = getenv("CMSelfFormats");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = getenv("CMExternalFormats");
      if (pcVar5 != (char *)0x0) {
        CMself_hosted_formats = 0;
      }
    }
    else {
      CMself_hosted_formats = 1;
    }
  }
  if (CMself_hosted_formats == 1) {
    cm_00 = (CManager)
            create_local_FMcontext(CMpbio_get_format_rep_callback,CMpbio_get_port_callback,in_RDI);
    uVar6 = create_FFSContext_FM(cm_00);
    *(undefined8 *)(in_RDI + 0xb0) = uVar6;
    iVar2 = CMtrace_val[6];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar2 = CMtrace_init(cm_00,in_stack_ffffffffffffffec);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = *(FILE **)(in_RDI + 0x120);
        _Var3 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_20);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_20,
                CONCAT44(in_stack_ffffffffffffffec,local_18));
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"\nUsing self-hosted PBIO formats\n");
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    free_FMcontext(cm_00);
  }
  else {
    uVar6 = create_FFSContext_FM(0);
    *(undefined8 *)(in_RDI + 0xb0) = uVar6;
    uVar6 = FMContext_from_FFS(*(undefined8 *)(in_RDI + 0xb0));
    FMcontext_allow_self_formats(uVar6);
    iVar2 = CMtrace_val[6];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar2 = CMtrace_init(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = *(FILE **)(in_RDI + 0x120);
        _Var3 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_30);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"\nUsing external PBIO format server\n");
    }
    fflush(*(FILE **)(in_RDI + 0x120));
  }
  uVar6 = FMContext_from_FFS(*(undefined8 *)(in_RDI + 0xb0));
  uVar4 = FMcontext_get_format_server_identifier(uVar6);
  *(undefined4 *)(in_RDI + 0xb8) = uVar4;
  if (*(int *)(in_RDI + 0xb8) == -1) {
    CMself_hosted_formats = 1;
  }
  return;
}

Assistant:

extern void
CMinit_local_formats(CManager cm)
{
    if (CMself_hosted_formats == -1) {
	CMself_hosted_formats = CM_SELF_FORMATS;  /* default set in CMake */
	if (getenv("CMSelfFormats") != NULL) {
	    CMself_hosted_formats = 1;
	} else if (getenv("CMExternalFormats") != NULL) {
	    CMself_hosted_formats = 0;
	}
    }
    if (CMself_hosted_formats == 1) {
	FMContext fmc = 
	    create_local_FMcontext(CMpbio_get_format_rep_callback, 
				   CMpbio_get_port_callback, cm);
	cm->FFScontext = create_FFSContext_FM(fmc);
	CMtrace_out(cm, CMFormatVerbose, 
		    "\nUsing self-hosted PBIO formats\n");
	free_FMcontext(fmc);  /* really just drop the ref count */
    } else {
	cm->FFScontext = create_FFSContext();
	FMcontext_allow_self_formats(FMContext_from_FFS(cm->FFScontext));
	CMtrace_out(cm, CMFormatVerbose, 
		    "\nUsing external PBIO format server\n");
    }
    cm->FFSserver_identifier = FMcontext_get_format_server_identifier(FMContext_from_FFS(cm->FFScontext));
    if (cm->FFSserver_identifier == -1) {
	CMself_hosted_formats = 1;
    }
//   handle these natively to avoid foreign handlers     
//    INT_CMregister_non_CM_message_handler(0x5042494f, CM_pbio_query);
//    INT_CMregister_non_CM_message_handler(0x4f494250, CM_pbio_query);
}